

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

interval_t
duckdb::NegateOperator::Operation<duckdb::interval_t,duckdb::interval_t>(interval_t input)

{
  OutOfRangeException *this;
  interval_t iVar1;
  string local_40;
  
  if (input.micros == -0x8000000000000000) {
    this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Overflow in negation of integer!","");
    OutOfRangeException::OutOfRangeException(this,&local_40);
    __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1.micros = -input.micros;
  iVar1._0_8_ = (ulong)(uint)-input.months - (input._0_8_ & 0xffffffff00000000);
  return iVar1;
}

Assistant:

static bool CanNegate(T input) {
		using Limits = NumericLimits<T>;
		return !(Limits::IsSigned() && Limits::Minimum() == input);
	}